

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSOneofArray_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field)

{
  FieldDescriptor *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string local_a8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string local_78 [8];
  Descriptor *in_stack_ffffffffffffff90;
  GeneratorOptions *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [32];
  FieldDescriptor *local_18;
  
  local_18 = in_RDX;
  FieldDescriptor::containing_type(in_RDX);
  OneofFieldsArrayName_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_RSI,(char *)in_RDI);
  FieldDescriptor::containing_oneof(local_18);
  JSOneofIndex_abi_cxx11_((OneofDescriptor *)in_stack_ffffffffffffff98);
  std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  return in_RDI;
}

Assistant:

std::string JSOneofArray(const GeneratorOptions& options,
                         const FieldDescriptor* field) {
  return OneofFieldsArrayName(options, field->containing_type()) + "[" +
         JSOneofIndex(field->containing_oneof()) + "]";
}